

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O3

GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> * __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::operator=
          (GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *this,
          GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *Wrapper)

{
  GLuint local_14;
  
  if (this->m_uiHandle != 0) {
    if ((this->m_CreateReleaseHelper).m_ExternalFBOHandle == 0) {
      (*__glewDeleteFramebuffers)(1,&local_14);
    }
    else {
      (this->m_CreateReleaseHelper).m_ExternalFBOHandle = 0;
    }
    this->m_uiHandle = 0;
  }
  this->m_uiHandle = Wrapper->m_uiHandle;
  (this->m_CreateReleaseHelper).m_ExternalFBOHandle =
       (Wrapper->m_CreateReleaseHelper).m_ExternalFBOHandle;
  (this->m_UniqueId).m_ID = (Wrapper->m_UniqueId).m_ID;
  (Wrapper->m_UniqueId).m_ID = 0;
  Wrapper->m_uiHandle = 0;
  return this;
}

Assistant:

GLObjWrapper& operator=(GLObjWrapper&& Wrapper) noexcept
    {
        Release();

        m_uiHandle            = Wrapper.m_uiHandle;
        m_CreateReleaseHelper = std::move(Wrapper.m_CreateReleaseHelper);
        m_UniqueId            = std::move(Wrapper.m_UniqueId);

        Wrapper.m_uiHandle = 0;

        return *this;
    }